

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O0

void framebuffer_size_callback(GLFWwindow *window,int width,int height)

{
  undefined4 local_1c;
  float ratio;
  int height_local;
  int width_local;
  GLFWwindow *window_local;
  
  local_1c = 1.0;
  if (0 < height) {
    local_1c = (float)width / (float)height;
  }
  glViewport(0,0,width,height);
  glMatrixMode(0x1701);
  glLoadIdentity();
  gluPerspective(0x404e000000000000,(double)local_1c,0x3ff0000000000000,0x4090000000000000);
  return;
}

Assistant:

void framebuffer_size_callback(GLFWwindow* window, int width, int height)
{
    float ratio = 1.f;

    if (height > 0)
        ratio = (float) width / (float) height;

    // Setup viewport
    glViewport(0, 0, width, height);

    // Change to the projection matrix and set our viewing volume
    glMatrixMode(GL_PROJECTION);
    glLoadIdentity();
    gluPerspective(60.0, ratio, 1.0, 1024.0);
}